

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

ssize_t __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write
          (xml_buffered_writer *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  char_t in_R8B;
  
  uVar1 = this->bufsize;
  if (0x7fc < uVar1) {
    flush(this);
    uVar1 = 0;
  }
  this->buffer[uVar1] = (char_t)__fd;
  this->buffer[uVar1 + 1] = (char_t)__buf;
  this->buffer[uVar1 + 2] = (char_t)__n;
  this->buffer[uVar1 + 3] = in_R8B;
  this->bufsize = uVar1 + 4;
  return uVar1 + 4;
}

Assistant:

void write(char_t d0, char_t d1, char_t d2, char_t d3)
		{
			size_t offset = bufsize;
			if (offset > bufcapacity - 4) offset = flush();

			buffer[offset + 0] = d0;
			buffer[offset + 1] = d1;
			buffer[offset + 2] = d2;
			buffer[offset + 3] = d3;
			bufsize = offset + 4;
		}